

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Struct2Local::visitRefEq(Struct2Local *this,RefEq *curr)

{
  ParentChildInteraction PVar1;
  bool bVar2;
  Block *expression;
  Builder *this_00;
  optional<wasm::Type> type;
  bool local_91;
  undefined1 local_80 [2] [12];
  Literal local_60;
  Drop *local_48;
  Drop *local_40;
  Const *local_38;
  initializer_list<wasm::Expression_*> local_30;
  uint local_20;
  BasicType local_1c;
  int32_t result;
  RefEq *curr_local;
  Struct2Local *this_local;
  
  _result = curr;
  curr_local = (RefEq *)this;
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    local_1c = unreachable;
    bVar2 = wasm::Type::operator==
                      (&(_result->super_SpecificExpression<(wasm::Expression::Id)44>).
                        super_Expression.type,&local_1c);
    if (!bVar2) {
      PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,_result->left);
      local_91 = false;
      if (PVar1 == Flows) {
        PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,_result->right);
        local_91 = PVar1 == Flows;
      }
      local_20 = (uint)local_91;
      this_00 = &this->builder;
      local_48 = Builder::makeDrop(this_00,_result->left);
      local_40 = Builder::makeDrop(this_00,_result->right);
      wasm::Literal::Literal(&local_60,local_20);
      local_38 = Builder::makeConst(this_00,&local_60);
      local_30._M_array = (iterator)&local_48;
      local_30._M_len = 3;
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_80);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_80[0]._0_8_;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_80[0][8];
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_80[0]._9_3_;
      expression = Builder::makeBlock(this_00,&local_30,type);
      replaceCurrent(this,(Expression *)expression);
      wasm::Literal::~Literal(&local_60);
    }
  }
  return;
}

Assistant:

void visitRefEq(RefEq* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    if (curr->type == Type::unreachable) {
      // The result does not matter. Leave things as they are (and let DCE
      // handle it).
      return;
    }

    // If our reference is compared to itself, the result is 1. If it is
    // compared to something else, the result must be 0, as our reference does
    // not escape to any other place.
    int32_t result =
      analyzer.getInteraction(curr->left) == ParentChildInteraction::Flows &&
      analyzer.getInteraction(curr->right) == ParentChildInteraction::Flows;
    replaceCurrent(builder.makeBlock({builder.makeDrop(curr->left),
                                      builder.makeDrop(curr->right),
                                      builder.makeConst(Literal(result))}));
  }